

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryGetOwnPropertySymbols
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  int iVar4;
  CallFlags e;
  TypeId TVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  JavascriptLibrary *this_00;
  JavascriptArray *pJVar8;
  RecyclableObject *local_90;
  Arguments local_78;
  CallInfo local_68;
  Var result;
  RecyclableObject *object;
  Var tempVar;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  iVar4 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar4);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x42f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  tempVar = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x432,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((uint)scriptContext & 0xffffff) < 2) {
    this_00 = ScriptContext::GetLibrary((ScriptContext *)tempVar);
    local_90 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  else {
    local_90 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  object = local_90;
  result = Js::JavascriptOperators::ToObject(local_90,(ScriptContext *)tempVar);
  TVar5 = RecyclableObject::GetTypeId((RecyclableObject *)result);
  pvVar2 = result;
  if (TVar5 == TypeIds_HostDispatch) {
    Arguments::Arguments(&local_78,(Arguments *)&scriptContext);
    iVar4 = (**(code **)(*pvVar2 + 0x2a8))(pvVar2,EntryGetOwnPropertySymbols,&local_78,&local_68);
    if (iVar4 != 0) {
      return (Var)local_68;
    }
  }
  pJVar8 = Js::JavascriptOperators::GetOwnPropertySymbols(result,(ScriptContext *)tempVar);
  return pJVar8;
}

Assistant:

Var JavascriptObject::EntryGetOwnPropertySymbols(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    Var tempVar = args.Info.Count < 2 ? scriptContext->GetLibrary()->GetUndefined() : args[1];
    RecyclableObject *object = JavascriptOperators::ToObject(tempVar, scriptContext);

    if (object->GetTypeId() == TypeIds_HostDispatch)
    {
        Var result;
        if (object->InvokeBuiltInOperationRemotely(EntryGetOwnPropertySymbols, args, &result))
        {
            return result;
        }
    }

    return JavascriptOperators::GetOwnPropertySymbols(object, scriptContext);
}